

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

void Gia_ResbInit(Gia_ResbMan_t *p,Vec_Ptr_t *vDivs,int nWords,int nLimit,int nDivsMax,int iChoice,
                 int fUseXor,int fDebug,int fVerbose,int fVeryVerbose)

{
  word *pwVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  
  if (p->nWords != nWords) {
    __assert_fail("p->nWords == nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x154,
                  "void Gia_ResbInit(Gia_ResbMan_t *, Vec_Ptr_t *, int, int, int, int, int, int, int, int)"
                 );
  }
  p->nLimit = nLimit;
  p->nDivsMax = nDivsMax;
  p->iChoice = iChoice;
  p->fUseXor = fUseXor;
  p->fDebug = fDebug;
  p->fVerbose = fVerbose;
  p->fVeryVerbose = fVeryVerbose;
  iVar5 = vDivs->nSize;
  if (0 < iVar5) {
    if (nWords < 1) {
      if (iVar5 != 1) goto LAB_0079ab03;
    }
    else {
      pwVar1 = p->pSets[0];
      ppvVar4 = vDivs->pArray;
      pvVar2 = *ppvVar4;
      uVar6 = 0;
      do {
        pwVar1[uVar6] = *(word *)((long)pvVar2 + uVar6 * 8);
        uVar6 = uVar6 + 1;
      } while ((uint)nWords != uVar6);
      if (iVar5 != 1) {
        pwVar1 = p->pSets[1];
        pvVar2 = ppvVar4[1];
        uVar6 = 0;
        do {
          pwVar1[uVar6] = *(word *)((long)pvVar2 + uVar6 * 8);
          uVar6 = uVar6 + 1;
        } while ((uint)nWords != uVar6);
LAB_0079ab03:
        pVVar3 = p->vDivs;
        pVVar3->nSize = 0;
        if (0 < vDivs->nSize) {
          uVar6 = (ulong)(uint)pVVar3->nCap;
          iVar5 = 0;
          lVar8 = 0;
          do {
            pvVar2 = vDivs->pArray[lVar8];
            iVar7 = (int)uVar6;
            if (iVar5 == iVar7) {
              if (iVar7 < 0x10) {
                if (pVVar3->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
                }
                pVVar3->pArray = ppvVar4;
                pVVar3->nCap = 0x10;
                uVar6 = 0x10;
              }
              else {
                uVar6 = (ulong)(uint)(iVar7 * 2);
                if (pVVar3->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(uVar6 * 8);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar3->pArray,uVar6 * 8);
                }
                pVVar3->pArray = ppvVar4;
                pVVar3->nCap = iVar7 * 2;
              }
            }
            else {
              ppvVar4 = pVVar3->pArray;
            }
            iVar7 = pVVar3->nSize;
            iVar5 = iVar7 + 1;
            pVVar3->nSize = iVar5;
            ppvVar4[iVar7] = pvVar2;
            lVar8 = lVar8 + 1;
          } while (lVar8 < vDivs->nSize);
        }
        p->vGates->nSize = 0;
        p->vUnateLits[0]->nSize = 0;
        p->vUnateLits[1]->nSize = 0;
        p->vNotUnateVars[0]->nSize = 0;
        p->vNotUnateVars[1]->nSize = 0;
        p->vUnatePairs[0]->nSize = 0;
        p->vUnatePairs[1]->nSize = 0;
        p->vUnateLitsW[0]->nSize = 0;
        p->vUnateLitsW[1]->nSize = 0;
        p->vUnatePairsW[0]->nSize = 0;
        p->vUnatePairsW[1]->nSize = 0;
        p->vBinateVars->nSize = 0;
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Gia_ResbInit( Gia_ResbMan_t * p, Vec_Ptr_t * vDivs, int nWords, int nLimit, int nDivsMax, int iChoice, int fUseXor, int fDebug, int fVerbose, int fVeryVerbose )
{
    assert( p->nWords == nWords );
    p->nLimit       = nLimit;
    p->nDivsMax     = nDivsMax;
    p->iChoice      = iChoice;
    p->fUseXor      = fUseXor;
    p->fDebug       = fDebug;
    p->fVerbose     = fVerbose;
    p->fVeryVerbose = fVeryVerbose;
    Abc_TtCopy( p->pSets[0], (word *)Vec_PtrEntry(vDivs, 0), nWords, 0 );
    Abc_TtCopy( p->pSets[1], (word *)Vec_PtrEntry(vDivs, 1), nWords, 0 );
    Vec_PtrClear( p->vDivs );
    Vec_PtrAppend( p->vDivs, vDivs );
    Vec_IntClear( p->vGates );
    Vec_IntClear( p->vUnateLits[0]    );
    Vec_IntClear( p->vUnateLits[1]    );
    Vec_IntClear( p->vNotUnateVars[0] );
    Vec_IntClear( p->vNotUnateVars[1] );
    Vec_IntClear( p->vUnatePairs[0]   );
    Vec_IntClear( p->vUnatePairs[1]   );
    Vec_IntClear( p->vUnateLitsW[0]   );
    Vec_IntClear( p->vUnateLitsW[1]   );
    Vec_IntClear( p->vUnatePairsW[0]  );
    Vec_IntClear( p->vUnatePairsW[1]  );
    Vec_IntClear( p->vBinateVars      );
}